

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_typeinfo(lua_State *L)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  GCstr *pGVar5;
  TValue *pTVar6;
  ulong uVar7;
  long lVar8;
  long *plVar9;
  GCtab *t;
  GCstr *s;
  
  plVar9 = (long *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  plVar9[2] = (long)L;
  uVar3 = ffi_checkint(L,1);
  iVar4 = 0;
  if ((uVar3 != 0) && (uVar3 < *(uint *)(plVar9 + 1))) {
    lVar2 = *plVar9;
    lVar8 = (ulong)uVar3 * 0x10;
    lVar1 = lVar2 + lVar8;
    lua_createtable(L,0,4);
    t = (GCtab *)(ulong)L->top[-1].u32.lo;
    pGVar5 = lj_str_new(L,"info",4);
    pTVar6 = lj_tab_setstr(L,t,pGVar5);
    pTVar6->n = (double)*(int *)(lVar2 + lVar8);
    if (*(int *)(lVar2 + 4 + lVar8) != -1) {
      pGVar5 = lj_str_new(L,"size",4);
      pTVar6 = lj_tab_setstr(L,t,pGVar5);
      pTVar6->n = (double)*(int *)(lVar1 + 4);
    }
    if (*(short *)(lVar1 + 8) != 0) {
      pGVar5 = lj_str_new(L,"sib",3);
      pTVar6 = lj_tab_setstr(L,t,pGVar5);
      pTVar6->n = (double)*(ushort *)(lVar1 + 8);
    }
    uVar3 = *(uint *)(lVar1 + 0xc);
    uVar7 = (ulong)uVar3;
    if (uVar7 != 0) {
      if ((~*(byte *)((ulong)(L->glref).ptr32 + 0x58) & *(byte *)(uVar7 + 4) & 3) != 0) {
        *(byte *)(uVar7 + 4) = *(byte *)(uVar7 + 4) ^ 3;
      }
      pGVar5 = lj_str_new(L,"name",4);
      pTVar6 = lj_tab_setstr(L,t,pGVar5);
      (pTVar6->u32).lo = uVar3;
      (pTVar6->field_2).it = 0xfffffffb;
    }
    uVar7 = (ulong)(L->glref).ptr32;
    iVar4 = 1;
    if (*(uint *)(uVar7 + 0x54) <= *(uint *)(uVar7 + 0x50)) {
      lj_gc_step(L);
    }
  }
  return iVar4;
}

Assistant:

LJLIB_CF(ffi_typeinfo)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = (CTypeID)ffi_checkint(L, 1);
  if (id > 0 && id < cts->top) {
    CType *ct = ctype_get(cts, id);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "info")), (int32_t)ct->info);
    if (ct->size != CTSIZE_INVALID)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "size")), (int32_t)ct->size);
    if (ct->sib)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "sib")), (int32_t)ct->sib);
    if (gcref(ct->name)) {
      GCstr *s = gco2str(gcref(ct->name));
      if (isdead(G(L), obj2gco(s))) flipwhite(obj2gco(s));
      setstrV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "name")), s);
    }
    lj_gc_check(L);
    return 1;
  }
  return 0;
}